

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<InplaceStr,_8U>::~SmallArray(SmallArray<InplaceStr,_8U> *this)

{
  InplaceStr *pIVar1;
  
  pIVar1 = this->data;
  if (pIVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pIVar1 != (InplaceStr *)0x0) {
        (*(code *)NULLC::dealloc)(pIVar1);
      }
    }
    else if (pIVar1 != (InplaceStr *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}